

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase199::run(TestCase199 *this)

{
  __type _Var1;
  bool bVar2;
  bool _kj_shouldLog_19;
  MockException e_3;
  bool _kj_shouldLog_18;
  Fault f_4;
  bool _kj_shouldLog_17;
  MockException e_2;
  bool _kj_shouldLog_16;
  Fault f_3;
  bool _kj_shouldLog_15;
  MockException e_1;
  bool _kj_shouldLog_14;
  Fault f_2;
  bool _kj_shouldLog_13;
  bool _kj_shouldLog_12;
  Fault f_1;
  bool recovered;
  bool _kj_shouldLog_11;
  MockException e;
  bool _kj_shouldLog_10;
  Fault f;
  string local_4a8;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  bool local_422;
  allocator<char> local_421;
  undefined1 local_420 [6];
  bool _kj_shouldLog_9;
  string local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  bool local_39c;
  bool local_39b;
  bool local_39a;
  allocator<char> local_399;
  undefined1 local_398 [4];
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  bool local_312;
  allocator<char> local_311;
  undefined1 local_310 [6];
  bool _kj_shouldLog_5;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  bool local_28a;
  allocator<char> local_289;
  undefined1 local_288 [6];
  bool _kj_shouldLog_4;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  bool local_202;
  allocator<char> local_201;
  undefined1 local_200 [6];
  bool _kj_shouldLog_3;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  bool local_179;
  char *pcStack_178;
  bool _kj_shouldLog_2;
  char *str;
  int i;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  bool local_e2;
  allocator<char> local_e1;
  undefined1 local_e0 [6];
  bool _kj_shouldLog_1;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  bool local_4d;
  int local_4c;
  undefined1 local_48 [3];
  bool _kj_shouldLog;
  int line;
  MockExceptionCallback mockCallback;
  TestCase199 *this_local;
  
  mockCallback._48_8_ = this;
  MockExceptionCallback::MockExceptionCallback((MockExceptionCallback *)local_48);
  local_4d = Debug::shouldLog(WARNING);
  while (local_4d != false) {
    Debug::log<char_const(&)[13]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xcb,WARNING,"\"Hello world!\"",(char (*) [13])"Hello world!");
    local_4d = false;
  }
  local_4c = 0xcb;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_e1);
  fileLine(&local_c0,(string *)local_e0,local_4c);
  ::std::operator+(&local_a0,"log message: ",&local_c0);
  ::std::operator+(&local_80,&local_a0,":+0: warning: Hello world!\n");
  _Var1 = ::std::operator==(&local_80,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mockCallback.super_ExceptionCallback.next);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  if (!_Var1) {
    local_e2 = Debug::shouldLog(ERROR);
    while (local_e2 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,(allocator<char> *)((long)&str + 7));
      fileLine(&local_148,(string *)&i,local_4c);
      ::std::operator+(&local_128,"log message: ",&local_148);
      ::std::operator+(&local_108,&local_128,":+0: warning: Hello world!\n");
      Debug::log<char_const(&)[216],std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0xcd,ERROR,
                 "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: warning: Hello world!\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: warning: Hello world!\\n\", mockCallback.text"
                 ,(char (*) [216])
                  "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: warning: Hello world!\\n\") == (mockCallback.text)"
                 ,&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback.super_ExceptionCallback.next);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::__cxx11::string::~string((string *)&local_128);
      ::std::__cxx11::string::~string((string *)&local_148);
      ::std::__cxx11::string::~string((string *)&i);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&str + 7));
      local_e2 = false;
    }
  }
  ::std::__cxx11::string::clear();
  str._0_4_ = 0x7b;
  pcStack_178 = "foo";
  local_179 = Debug::shouldLog(ERROR);
  while (local_179 != false) {
    Debug::log<int&,char_const*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xd3,ERROR,"i, str",(int *)&str,&stack0xfffffffffffffe88);
    local_179 = false;
  }
  local_4c = 0xd3;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_200,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_201);
  fileLine(&local_1e0,(string *)local_200,local_4c);
  ::std::operator+(&local_1c0,"log message: ",&local_1e0);
  ::std::operator+(&local_1a0,&local_1c0,":+0: error: i = 123; str = foo\n");
  _Var1 = ::std::operator==(&local_1a0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mockCallback.super_ExceptionCallback.next);
  ::std::__cxx11::string::~string((string *)&local_1a0);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  ::std::__cxx11::string::~string((string *)local_200);
  ::std::allocator<char>::~allocator(&local_201);
  if (!_Var1) {
    local_202 = Debug::shouldLog(ERROR);
    while (local_202 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_288,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,&local_289);
      fileLine(&local_268,(string *)local_288,local_4c);
      ::std::operator+(&local_248,"log message: ",&local_268);
      ::std::operator+(&local_228,&local_248,":+0: error: i = 123; str = foo\n");
      Debug::log<char_const(&)[220],std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0xd5,ERROR,
                 "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: error: i = 123; str = foo\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: error: i = 123; str = foo\\n\", mockCallback.text"
                 ,(char (*) [220])
                  "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: error: i = 123; str = foo\\n\") == (mockCallback.text)"
                 ,&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback.super_ExceptionCallback.next);
      ::std::__cxx11::string::~string((string *)&local_228);
      ::std::__cxx11::string::~string((string *)&local_248);
      ::std::__cxx11::string::~string((string *)&local_268);
      ::std::__cxx11::string::~string((string *)local_288);
      ::std::allocator<char>::~allocator(&local_289);
      local_202 = false;
    }
  }
  ::std::__cxx11::string::clear();
  local_28a = Debug::shouldLog(DBG);
  while (local_28a != false) {
    Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xd8,DBG,"\"Some debug text.\"",(char (*) [17])"Some debug text.");
    local_28a = false;
  }
  local_4c = 0xd8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_311);
  fileLine(&local_2f0,(string *)local_310,local_4c);
  ::std::operator+(&local_2d0,"log message: ",&local_2f0);
  ::std::operator+(&local_2b0,&local_2d0,":+0: debug: Some debug text.\n");
  _Var1 = ::std::operator==(&local_2b0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mockCallback.super_ExceptionCallback.next);
  ::std::__cxx11::string::~string((string *)&local_2b0);
  ::std::__cxx11::string::~string((string *)&local_2d0);
  ::std::__cxx11::string::~string((string *)&local_2f0);
  ::std::__cxx11::string::~string((string *)local_310);
  ::std::allocator<char>::~allocator(&local_311);
  if (!_Var1) {
    local_312 = Debug::shouldLog(ERROR);
    while (local_312 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_398,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,&local_399);
      fileLine(&local_378,(string *)local_398,local_4c);
      ::std::operator+(&local_358,"log message: ",&local_378);
      ::std::operator+(&local_338,&local_358,":+0: debug: Some debug text.\n");
      Debug::log<char_const(&)[218],std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0xda,ERROR,
                 "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: debug: Some debug text.\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: debug: Some debug text.\\n\", mockCallback.text"
                 ,(char (*) [218])
                  "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: debug: Some debug text.\\n\") == (mockCallback.text)"
                 ,&local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback.super_ExceptionCallback.next);
      ::std::__cxx11::string::~string((string *)&local_338);
      ::std::__cxx11::string::~string((string *)&local_358);
      ::std::__cxx11::string::~string((string *)&local_378);
      ::std::__cxx11::string::~string((string *)local_398);
      ::std::allocator<char>::~allocator(&local_399);
      local_312 = false;
    }
  }
  ::std::__cxx11::string::clear();
  local_39a = Debug::shouldLog(INFO);
  while (local_39a != false) {
    Debug::log<char_const(&)[6]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xde,INFO,"\"Info.\"",(char (*) [6])"Info.");
    local_39a = false;
  }
  local_4c = 0xde;
  bVar2 = ::std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &mockCallback.super_ExceptionCallback.next);
  if (!bVar2) {
    local_39b = Debug::shouldLog(ERROR);
    while (local_39b != false) {
      Debug::log<char_const(&)[45],char_const(&)[1],std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (mockCallback.text)\", \"\", mockCallback.text"
                 ,(char (*) [45])"failed: expected (\"\") == (mockCallback.text)",
                 (char (*) [1])0x26f602,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback.super_ExceptionCallback.next);
      local_39b = false;
    }
  }
  ::std::__cxx11::string::clear();
  Debug::setLogLevel(INFO);
  local_39c = Debug::shouldLog(INFO);
  while (local_39c != false) {
    Debug::log<char_const(&)[11]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xe4,INFO,"\"Some text.\"",(char (*) [11])"Some text.");
    local_39c = false;
  }
  local_4c = 0xe4;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_420,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_421);
  fileLine(&local_400,(string *)local_420,local_4c);
  ::std::operator+(&local_3e0,"log message: ",&local_400);
  ::std::operator+(&local_3c0,&local_3e0,":+0: info: Some text.\n");
  _Var1 = ::std::operator==(&local_3c0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mockCallback.super_ExceptionCallback.next);
  ::std::__cxx11::string::~string((string *)&local_3c0);
  ::std::__cxx11::string::~string((string *)&local_3e0);
  ::std::__cxx11::string::~string((string *)&local_400);
  ::std::__cxx11::string::~string((string *)local_420);
  ::std::allocator<char>::~allocator(&local_421);
  if (!_Var1) {
    local_422 = Debug::shouldLog(ERROR);
    while (local_422 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,(allocator<char> *)((long)&f.exception + 7));
      fileLine(&local_488,&local_4a8,local_4c);
      ::std::operator+(&local_468,"log message: ",&local_488);
      ::std::operator+(&local_448,&local_468,":+0: info: Some text.\n");
      Debug::log<char_const(&)[211],std::__cxx11::string,std::__cxx11::string&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: info: Some text.\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: info: Some text.\\n\", mockCallback.text"
                 ,(char (*) [211])
                  "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: info: Some text.\\n\") == (mockCallback.text)"
                 ,&local_448,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mockCallback.super_ExceptionCallback.next);
      ::std::__cxx11::string::~string((string *)&local_448);
      ::std::__cxx11::string::~string((string *)&local_468);
      ::std::__cxx11::string::~string((string *)&local_488);
      ::std::__cxx11::string::~string((string *)&local_4a8);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&f.exception + 7));
      local_422 = false;
    }
  }
  ::std::__cxx11::string::clear();
  Debug::setLogLevel(WARNING);
  Debug::Fault::Fault((Fault *)&stack0xfffffffffffffb48,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                      ,0xed,FAILED,"1 == 2","");
  Debug::Fault::fatal((Fault *)&stack0xfffffffffffffb48);
}

Assistant:

TEST(Debug, Log) {
  MockExceptionCallback mockCallback;
  int line;

  KJ_LOG(WARNING, "Hello world!"); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: warning: Hello world!\n",
            mockCallback.text);
  mockCallback.text.clear();

  int i = 123;
  const char* str = "foo";

  KJ_LOG(ERROR, i, str); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: error: i = 123; str = foo\n",
            mockCallback.text);
  mockCallback.text.clear();

  KJ_DBG("Some debug text."); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: debug: Some debug text.\n",
            mockCallback.text);
  mockCallback.text.clear();

  // INFO logging is disabled by default.
  KJ_LOG(INFO, "Info."); line = __LINE__;
  EXPECT_EQ("", mockCallback.text);
  mockCallback.text.clear();

  // Enable it.
  Debug::setLogLevel(Debug::Severity::INFO);
  KJ_LOG(INFO, "Some text."); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: info: Some text.\n",
            mockCallback.text);
  mockCallback.text.clear();

  // Back to default.
  Debug::setLogLevel(Debug::Severity::WARNING);

  KJ_ASSERT(1 == 1);
  EXPECT_FATAL(KJ_ASSERT(1 == 2)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2\n", mockCallback.text);
  mockCallback.text.clear();

  KJ_ASSERT(1 == 1) {
    ADD_FAILURE() << "Shouldn't call recovery code when check passes.";
    break;
  };

  bool recovered = false;
  KJ_ASSERT(1 == 2, "1 is not 2") { recovered = true; break; } line = __LINE__;
  EXPECT_EQ("recoverable exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; 1 is not 2\n", mockCallback.text);
  EXPECT_TRUE(recovered);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_ASSERT(1 == 2, i, "hi", str)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; i = 123; hi; str = foo\n", mockCallback.text);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_REQUIRE(1 == 2, i, "hi", str)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; i = 123; hi; str = foo\n", mockCallback.text);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_FAIL_ASSERT("foo")); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: foo\n",
            mockCallback.text);
  mockCallback.text.clear();
}